

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O2

uv_handle_type uv_guess_handle(uv_file file)

{
  int iVar1;
  uint uVar2;
  int type;
  socklen_t len;
  sockaddr sa;
  stat s;
  
  if (file < 0) {
    return UV_UNKNOWN_HANDLE;
  }
  iVar1 = isatty(file);
  if (iVar1 != 0) {
    return UV_TTY;
  }
  iVar1 = fstat64(file,(stat64 *)&s);
  if (iVar1 != 0) {
    return UV_UNKNOWN_HANDLE;
  }
  uVar2 = s.st_mode & 0xf000;
  if ((short)uVar2 == -0x4000) {
    len = 4;
    iVar1 = getsockopt(file,1,3,&type,&len);
    if (iVar1 != 0) {
      return UV_UNKNOWN_HANDLE;
    }
    len = 0x10;
    iVar1 = getsockname(file,(sockaddr *)&sa,&len);
    if (iVar1 != 0) {
      return UV_UNKNOWN_HANDLE;
    }
    if (type == 1) {
      if ((sa.sa_family & 0xfff7) == 2) {
        return UV_TCP;
      }
      if (sa.sa_family == 1) {
        return UV_NAMED_PIPE;
      }
    }
    else if ((type == 2) && ((sa.sa_family & 0xfff7) == 2)) {
      return UV_UDP;
    }
  }
  else {
    if (uVar2 == 0x2000) {
      return UV_FILE;
    }
    if (uVar2 == 0x8000) {
      return UV_FILE;
    }
    if (uVar2 == 0x1000) {
      return UV_NAMED_PIPE;
    }
  }
  return UV_UNKNOWN_HANDLE;
}

Assistant:

uv_handle_type uv_guess_handle(uv_file file) {
  struct sockaddr sa;
  struct stat s;
  socklen_t len;
  int type;

  if (file < 0)
    return UV_UNKNOWN_HANDLE;

#if defined(__PASE__)
  /* On IBMi PASE isatty() always returns true for stdin, stdout and stderr.
   * Use ioctl() instead to identify whether it's actually a TTY.
   */
  if (!ioctl(file, TXISATTY + 0x81, NULL) || errno != ENOTTY)
#else
  if (isatty(file))
#endif
    return UV_TTY;

  if (fstat(file, &s))
    return UV_UNKNOWN_HANDLE;

  if (S_ISREG(s.st_mode))
    return UV_FILE;

  if (S_ISCHR(s.st_mode))
    return UV_FILE;  /* XXX UV_NAMED_PIPE? */

  if (S_ISFIFO(s.st_mode))
    return UV_NAMED_PIPE;

  if (!S_ISSOCK(s.st_mode))
    return UV_UNKNOWN_HANDLE;

  len = sizeof(type);
  if (getsockopt(file, SOL_SOCKET, SO_TYPE, &type, &len))
    return UV_UNKNOWN_HANDLE;

  len = sizeof(sa);
  if (getsockname(file, &sa, &len))
    return UV_UNKNOWN_HANDLE;

  if (type == SOCK_DGRAM)
    if (sa.sa_family == AF_INET || sa.sa_family == AF_INET6)
      return UV_UDP;

  if (type == SOCK_STREAM) {
#if defined(_AIX) || defined(__DragonFly__)
    /* on AIX/DragonFly the getsockname call returns an empty sa structure
     * for sockets of type AF_UNIX.  For all other types it will
     * return a properly filled in structure.
     */
    if (len == 0)
      return UV_NAMED_PIPE;
#endif /* defined(_AIX) || defined(__DragonFly__) */

    if (sa.sa_family == AF_INET || sa.sa_family == AF_INET6)
      return UV_TCP;
    if (sa.sa_family == AF_UNIX)
      return UV_NAMED_PIPE;
  }

  return UV_UNKNOWN_HANDLE;
}